

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
LeavesAtDifferentLevels_UpsertIteration_Test::TestBody
          (LeavesAtDifferentLevels_UpsertIteration_Test *this)

{
  bool bVar1;
  uint generation;
  type phVar2;
  pointer phVar3;
  char *pcVar4;
  value_pointer_type ppVar5;
  AssertHelper local_9f0;
  Message local_9e8;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_10;
  Message local_9c8;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_9;
  string v8;
  Message local_988;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_8;
  string v7;
  Message local_948;
  undefined1 local_940 [8];
  AssertionResult gtest_ar_7;
  string v6;
  Message local_908;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_6;
  string v5;
  string local_8c8;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_8a8;
  address local_7b0;
  AssertHelper local_7a8;
  Message local_7a0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_5;
  Message local_780;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_4;
  string *v4;
  Message local_758;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_3;
  string *v3;
  Message local_730;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_2;
  string *v2;
  Message local_708;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_1;
  string *v1;
  Message local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar;
  iterator end;
  iterator begin;
  string local_4e0;
  undefined1 local_4c0 [8];
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  itp;
  string local_3c0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_3a0;
  allocator local_2a1;
  string local_2a0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_280;
  allocator local_181;
  string local_180;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_160;
  unique_lock<mock_mutex> local_58;
  undefined1 local_48 [8];
  transaction_type t1;
  LeavesAtDifferentLevels_UpsertIteration_Test *this_local;
  
  t1.lock_._8_8_ = this;
  std::unique_lock<mock_mutex>::unique_lock
            (&local_58,
             (mutex_type *)
             &(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_48,
          &(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.super_IndexFixture.db_,
          &local_58);
  std::unique_lock<mock_mutex>::~unique_lock(&local_58);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_LeavesAtDifferentLevels).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"b",&local_181);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_160,phVar2,(transaction_type *)local_48,&local_180);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_LeavesAtDifferentLevels).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"c",&local_2a1);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_280,phVar2,(transaction_type *)local_48,&local_2a0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_LeavesAtDifferentLevels).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"d",(allocator *)&itp.field_0xf7);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_3a0,phVar2,(transaction_type *)local_48,&local_3c0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&itp.field_0xf7);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_LeavesAtDifferentLevels).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e0,"a",
             (allocator *)
             ((long)&begin.pos_._M_t.
                     super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
             + 7));
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_4c0,phVar2,(transaction_type *)local_48,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&begin.pos_._M_t.
                     super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
             + 7));
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::iterator_base
            ((iterator_base<false> *)&end.pos_,(iterator_base<false> *)local_4c0);
  phVar3 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_LeavesAtDifferentLevels).index_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((iterator *)&gtest_ar.message_,phVar3,
        &(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.super_IndexFixture.db_);
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>>
            ((internal *)local_6d8,"begin","end",(iterator_base<false> *)&end.pos_,
             (iterator_base<false> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x64d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v1,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v1);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::
         hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::iterator_base<false>::operator*((iterator_base<false> *)&end.pos_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_700,"\"a\"","v1",(char (*) [2])0x306a2f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x650,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v2,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v2);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::
         hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::iterator_base<false>::operator*((iterator_base<false> *)&end.pos_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_728,"\"b\"","v2",(char (*) [2])0x3013de,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x653,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v3,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v3);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::
         hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::iterator_base<false>::operator*((iterator_base<false> *)&end.pos_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_750,"\"c\"","v3",(char (*) [2])0x3063e5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             gtest_ar_3.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x656,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v4,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v4);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::
         hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::iterator_base<false>::operator*((iterator_base<false> *)&end.pos_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_778,"\"d\"","v4",(char (*) [2])0x2fc636,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             gtest_ar_4.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x659,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            ((EqHelper *)local_798,"begin","end",(iterator_base<false> *)&end.pos_,
             (iterator_base<false> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x65b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  phVar3 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_LeavesAtDifferentLevels).index_);
  generation = pstore::database::get_current_revision
                         (&(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.
                           super_IndexFixture.db_);
  local_7b0.a_ = (value_type)
                 pstore::index::
                 hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::flush(phVar3,(transaction_base *)local_48,generation);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_LeavesAtDifferentLevels).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8c8,"a",(allocator *)(v5.field_2._M_local_buf + 0xf));
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_8a8,phVar2,(transaction_type *)local_48,&local_8c8);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::operator=((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
               *)local_4c0,&local_8a8);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)(v5.field_2._M_local_buf + 0xf));
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator=
            ((iterator_base<false> *)&end.pos_,(iterator_base<false> *)local_4c0);
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator->((iterator_base<false> *)&end.pos_);
  std::__cxx11::string::string((string *)&gtest_ar_6.message_,(string *)ppVar5);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_900,"\"a\"","v5",(char (*) [2])0x306a2f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_6.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&v6.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x663,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&v6.field_2 + 8),&local_908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&v6.field_2 + 8));
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator->((iterator_base<false> *)&end.pos_);
  std::__cxx11::string::string((string *)&gtest_ar_7.message_,(string *)ppVar5);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_940,"\"b\"","v6",(char (*) [2])0x3013de,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_7.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(&local_948);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_940);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&v7.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x666,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&v7.field_2 + 8),&local_948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&v7.field_2 + 8));
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator->((iterator_base<false> *)&end.pos_);
  std::__cxx11::string::string((string *)&gtest_ar_8.message_,(string *)ppVar5);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_980,"\"c\"","v7",(char (*) [2])0x3063e5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_8.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&v8.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x669,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&v8.field_2 + 8),&local_988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&v8.field_2 + 8));
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator->((iterator_base<false> *)&end.pos_);
  std::__cxx11::string::string((string *)&gtest_ar_9.message_,(string *)ppVar5);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_9c0,"\"d\"","v8",(char (*) [2])0x2fc636,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_9.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x66c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)&end.pos_);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            ((EqHelper *)local_9e0,"begin","end",(iterator_base<false> *)&end.pos_,
             (iterator_base<false> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x66e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9f0,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper(&local_9f0);
    testing::Message::~Message(&local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::~iterator_base((iterator_base<false> *)&gtest_ar.message_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::~iterator_base((iterator_base<false> *)&end.pos_);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
           *)local_4c0);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_48);
  return;
}

Assistant:

TEST_F (LeavesAtDifferentLevels, UpsertIteration) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");
    this->insert_or_assign (*index_, t1, "d");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "a");

    test_trie::iterator begin = itp.first;
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const & v1 = (*begin).first;
    EXPECT_EQ ("a", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("b", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    std::string const & v4 = (*begin).first;
    EXPECT_EQ ("d", v4);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());

    // Check trie iterator in the store.
    itp = this->insert_or_assign (*index_, t1, "a");
    begin = itp.first;
    std::string const v5 = begin->first;
    EXPECT_EQ ("a", v5);
    ++begin;
    std::string const v6 = begin->first;
    EXPECT_EQ ("b", v6);
    ++begin;
    std::string const v7 = begin->first;
    EXPECT_EQ ("c", v7);
    ++begin;
    std::string const v8 = begin->first;
    EXPECT_EQ ("d", v8);
    ++begin;
    EXPECT_EQ (begin, end);
}